

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_dart.cpp
# Opt level: O2

void __thiscall
flatbuffers::dart::DartGenerator::GenObjectBuilder
          (DartGenerator *this,StructDef *struct_def,
          vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
          *non_deprecated_fields,string *builder_name,string *code)

{
  bool bVar1;
  FieldDef *pFVar2;
  Namespace *pNVar3;
  string *psVar4;
  pointer ppVar5;
  vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
  *pvVar6;
  char *__lhs;
  allocator<char> local_169;
  vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
  *local_168;
  string *local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  DartGenerator *local_118;
  IdlNamer *local_110;
  StructDef *local_108;
  pointer local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string *local_b8;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  local_118 = this;
  local_108 = struct_def;
  std::operator+(&local_d8,"class ",builder_name);
  std::operator+(&local_f8,&local_d8," extends ");
  std::operator+(&local_138,&local_f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _kFb_abi_cxx11_);
  std::operator+(&local_158,&local_138,".ObjectBuilder {\n");
  local_b8 = builder_name;
  std::__cxx11::string::append((string *)code);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_d8);
  local_110 = &local_118->namer_;
  ppVar5 = (non_deprecated_fields->
           super__Vector_base<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_168 = non_deprecated_fields;
  local_160 = code;
  while (ppVar5 != (local_168->
                   super__Vector_base<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish) {
    pFVar2 = ppVar5->second;
    pNVar3 = (local_108->super_Definition).defined_namespace;
    bVar1 = local_108->fixed;
    local_100 = ppVar5;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"ObjectBuilder",&local_169);
    GenDartTypeName(&local_b0,local_118,&(pFVar2->value).type,pNVar3,pFVar2,(bool)(bVar1 ^ 1),
                    &local_50);
    std::operator+(&local_d8,"  final ",&local_b0);
    std::operator+(&local_f8,&local_d8," _");
    (*(local_110->super_Namer)._vptr_Namer[7])(&local_90,local_110,pFVar2);
    std::operator+(&local_138,&local_f8,&local_90);
    code = local_160;
    std::operator+(&local_158,&local_138,";\n");
    std::__cxx11::string::append((string *)code);
    std::__cxx11::string::~string((string *)&local_158);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_50);
    ppVar5 = local_100 + 1;
  }
  std::__cxx11::string::append((char *)code);
  std::operator+(&local_138,"  ",local_b8);
  std::operator+(&local_158,&local_138,"(");
  std::__cxx11::string::append((string *)code);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_138);
  pvVar6 = local_168;
  if ((local_168->
      super__Vector_base<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
      )._M_impl.super__Vector_impl_data._M_finish ==
      (local_168->
      super__Vector_base<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    std::__cxx11::string::append((char *)code);
  }
  else {
    std::__cxx11::string::append((char *)code);
    ppVar5 = (pvVar6->
             super__Vector_base<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    while (pvVar6 = local_168,
          ppVar5 != (local_168->
                    super__Vector_base<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish) {
      pFVar2 = ppVar5->second;
      local_100 = ppVar5;
      std::__cxx11::string::append((char *)code);
      bVar1 = local_108->fixed;
      __lhs = "";
      if (bVar1 != false) {
        __lhs = "required ";
      }
      pNVar3 = (local_108->super_Definition).defined_namespace;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,"ObjectBuilder",&local_169);
      GenDartTypeName(&local_b0,local_118,&(pFVar2->value).type,pNVar3,pFVar2,(bool)(bVar1 ^ 1),
                      &local_70);
      std::operator+(&local_d8,__lhs,&local_b0);
      std::operator+(&local_f8,&local_d8," ");
      (*(local_110->super_Namer)._vptr_Namer[7])(&local_90,local_110,pFVar2);
      std::operator+(&local_138,&local_f8,&local_90);
      std::operator+(&local_158,&local_138,",\n");
      std::__cxx11::string::append((string *)local_160);
      std::__cxx11::string::~string((string *)&local_158);
      std::__cxx11::string::~string((string *)&local_138);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_70);
      code = local_160;
      ppVar5 = local_100 + 1;
    }
    std::__cxx11::string::append((char *)code);
    std::__cxx11::string::append((char *)code);
    for (ppVar5 = (pvVar6->
                  super__Vector_base<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        ppVar5 != (pvVar6->
                  super__Vector_base<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish; ppVar5 = ppVar5 + 1) {
      pFVar2 = ppVar5->second;
      (*(local_110->super_Namer)._vptr_Namer[7])(&local_d8,local_110,pFVar2);
      std::operator+(&local_f8,"_",&local_d8);
      std::operator+(&local_138,&local_f8," = ");
      (*(local_110->super_Namer)._vptr_Namer[7])(&local_b0,local_110,pFVar2);
      std::operator+(&local_158,&local_138,&local_b0);
      psVar4 = local_160;
      std::__cxx11::string::append((string *)local_160);
      std::__cxx11::string::~string((string *)&local_158);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_138);
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_d8);
      pvVar6 = local_168;
      std::__cxx11::string::append((char *)psVar4);
    }
  }
  psVar4 = local_160;
  std::__cxx11::string::append((char *)local_160);
  std::__cxx11::string::append((char *)psVar4);
  std::operator+(&local_138,"  int finish(",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _kFb_abi_cxx11_);
  std::operator+(&local_158,&local_138,".Builder fbBuilder) {\n");
  std::__cxx11::string::append((string *)psVar4);
  pvVar6 = local_168;
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_138);
  GenObjectBuilderImplementation_abi_cxx11_(&local_158,local_118,local_108,pvVar6,true,false);
  std::__cxx11::string::append((string *)psVar4);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::append((char *)psVar4);
  std::__cxx11::string::append((char *)psVar4);
  std::__cxx11::string::append((char *)psVar4);
  std::__cxx11::string::append((char *)psVar4);
  std::operator+(&local_138,"    final fbBuilder = ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _kFb_abi_cxx11_);
  std::operator+(&local_158,&local_138,".Builder(deduplicateTables: false);\n");
  std::__cxx11::string::append((string *)psVar4);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::append((char *)psVar4);
  std::__cxx11::string::append((char *)psVar4);
  std::__cxx11::string::append((char *)psVar4);
  std::__cxx11::string::append((char *)psVar4);
  return;
}

Assistant:

void GenObjectBuilder(
      const StructDef &struct_def,
      const std::vector<std::pair<int, FieldDef *>> &non_deprecated_fields,
      const std::string &builder_name, std::string &code) {
    code += "class " + builder_name + " extends " + _kFb + ".ObjectBuilder {\n";
    for (auto it = non_deprecated_fields.begin();
         it != non_deprecated_fields.end(); ++it) {
      const FieldDef &field = *it->second;

      code += "  final " +
              GenDartTypeName(field.value.type, struct_def.defined_namespace,
                              field, !struct_def.fixed, "ObjectBuilder") +
              " _" + namer_.Variable(field) + ";\n";
    }
    code += "\n";
    code += "  " + builder_name + "(";

    if (non_deprecated_fields.size() != 0) {
      code += "{\n";
      for (auto it = non_deprecated_fields.begin();
           it != non_deprecated_fields.end(); ++it) {
        const FieldDef &field = *it->second;

        code += "    ";
        code += (struct_def.fixed ? "required " : "") +
                GenDartTypeName(field.value.type, struct_def.defined_namespace,
                                field, !struct_def.fixed, "ObjectBuilder") +
                " " + namer_.Variable(field) + ",\n";
      }
      code += "  })\n";
      code += "      : ";
      for (auto it = non_deprecated_fields.begin();
           it != non_deprecated_fields.end(); ++it) {
        const FieldDef &field = *it->second;

        code += "_" + namer_.Variable(field) + " = " + namer_.Variable(field);
        if (it == non_deprecated_fields.end() - 1) {
          code += ";\n\n";
        } else {
          code += ",\n        ";
        }
      }
    } else {
      code += ");\n\n";
    }

    code += "  /// Finish building, and store into the [fbBuilder].\n";
    code += "  @override\n";
    code += "  int finish(" + _kFb + ".Builder fbBuilder) {\n";
    code += GenObjectBuilderImplementation(struct_def, non_deprecated_fields);
    code += "  }\n\n";

    code += "  /// Convenience method to serialize to byte list.\n";
    code += "  @override\n";
    code += "  Uint8List toBytes([String? fileIdentifier]) {\n";
    code += "    final fbBuilder = " + _kFb +
            ".Builder(deduplicateTables: false);\n";
    code += "    fbBuilder.finish(finish(fbBuilder), fileIdentifier);\n";
    code += "    return fbBuilder.buffer;\n";
    code += "  }\n";
    code += "}\n";
  }